

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O2

void uint_hash_clear(uint_hash *h)

{
  uint_hash_entry **ppuVar1;
  uint_hash_entry *e;
  size_t i;
  ulong uVar2;
  
  if ((h != (uint_hash *)0x0) && (h->table != (uint_hash_entry **)0x0)) {
    for (uVar2 = 0; uVar2 < h->slots; uVar2 = uVar2 + 1) {
      ppuVar1 = h->table;
      while (e = ppuVar1[uVar2], e != (uint_hash_entry *)0x0) {
        ppuVar1[uVar2] = e->next;
        h->size = h->size - 1;
        uint_hash_entry_destroy(h,e);
      }
    }
  }
  return;
}

Assistant:

static void uint_hash_clear(struct uint_hash *h)
{
  if(h && h->table) {
    struct uint_hash_entry *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
      }
    }
  }
}